

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qwidget.cpp
# Opt level: O0

void __thiscall QWidgetPrivate::deleteExtra(QWidgetPrivate *this)

{
  bool bVar1;
  QStyleSheetStyle *this_00;
  QWidgetPrivate *in_RDI;
  QWidgetPrivate *unaff_retaddr;
  QStyleSheetStyle *proxy;
  
  bVar1 = std::unique_ptr::operator_cast_to_bool
                    ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35abbf);
  if (bVar1) {
    deleteSysExtra(in_RDI);
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35abdb);
    ::QPointer::operator_cast_to_QStyle_((QPointer<QStyle> *)0x35abe7);
    this_00 = qt_styleSheet((QStyle *)0x35abef);
    if (this_00 != (QStyleSheetStyle *)0x0) {
      QStyleSheetStyle::deref(this_00);
    }
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::operator->
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)0x35ac13);
    bVar1 = std::unique_ptr::operator_cast_to_bool
                      ((unique_ptr<QTLWExtra,_std::default_delete<QTLWExtra>_> *)0x35ac1f);
    if (bVar1) {
      deleteTLSysExtra(unaff_retaddr);
    }
    std::unique_ptr<QWExtra,_std::default_delete<QWExtra>_>::reset
              ((unique_ptr<QWExtra,_std::default_delete<QWExtra>_> *)this_00,(pointer)in_RDI);
  }
  return;
}

Assistant:

void QWidgetPrivate::deleteExtra()
{
    if (extra) {                                // if exists
        deleteSysExtra();
#ifndef QT_NO_STYLE_STYLESHEET
        // dereference the stylesheet style
        if (QStyleSheetStyle *proxy = qt_styleSheet(extra->style))
            proxy->deref();
#endif
        if (extra->topextra)
            deleteTLSysExtra();

        // extra->xic destroyed in QWidget::destroy()
        extra.reset();
    }
}